

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v11::detail::bigint::align(bigint *this,bigint *other)

{
  uint *__s;
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  uVar3 = this->exp_ - other->exp_;
  if (uVar3 != 0 && other->exp_ <= this->exp_) {
    uVar1 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
    buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)(uVar3 + uVar1));
    __s = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar2 = __s + (int)(uVar1 + uVar3 + -1);
    while (uVar1 = uVar1 - 1, -1 < (int)uVar1) {
      *puVar2 = __s[uVar1];
      puVar2 = puVar2 + -1;
    }
    memset(__s,0,(ulong)uVar3 << 2);
    this->exp_ = this->exp_ - uVar3;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    memset(bigits_.data(), 0, to_unsigned(exp_difference) * sizeof(bigit));
    exp_ -= exp_difference;
  }